

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O1

string * Uri::Uri::referenceResolution(string *__return_storage_ptr__,string *scheme,string *path)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((char *)scheme);
  if (((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)scheme), iVar2 == 0)) ||
     (iVar2 = std::__cxx11::string::compare((char *)scheme), iVar2 == 0)) {
    if (path->_M_string_length == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"/","");
      return __return_storage_ptr__;
    }
    if (*(path->_M_dataplus)._M_p != '/') {
      std::operator+(__return_storage_ptr__,"/",path);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string Uri::referenceResolution (const string &scheme, const string &path) {
    if (scheme == "https" || scheme == "http" || scheme == "file") {
        if (path.empty()) {
            return "/";
        }

        if (path[0] != '/') {
            return "/" + path;
        }
    }

    return path;
}